

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deString.c
# Opt level: O2

size_t deStrnlen(char *string,size_t maxSize)

{
  size_t sVar1;
  size_t len;
  size_t sVar2;
  
  for (sVar2 = 0; (sVar1 = maxSize, maxSize != sVar2 && (sVar1 = sVar2, string[sVar2] != '\0'));
      sVar2 = sVar2 + 1) {
  }
  return sVar1;
}

Assistant:

size_t deStrnlen (const char* string, size_t maxSize)
{
#if ((DE_COMPILER == DE_COMPILER_MSC) && (DE_OS != DE_OS_WINCE))
	return strnlen_s(string, maxSize);
#else
	size_t len = 0;
	while (len < maxSize && string[len] != 0)
		++len;
	return len;
#endif
}